

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluVarTypeUtil.cpp
# Opt level: O3

ostream * glu::operator<<(ostream *str,TypeAccessFormat *format)

{
  Type TVar1;
  long lVar2;
  char *__s;
  ostream *poVar3;
  size_t sVar4;
  long lVar5;
  pointer pVVar6;
  StructType *pSVar7;
  
  pVVar6 = (format->path->
           super__Vector_base<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_>).
           _M_impl.super__Vector_impl_data._M_start;
  if (pVVar6 != (format->path->
                super__Vector_base<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_>).
                _M_impl.super__Vector_impl_data._M_finish) {
    pSVar7 = (StructType *)format->type;
    do {
      TVar1 = pVVar6->type;
      if (TVar1 - MATRIX_COLUMN < 2) {
LAB_0084aec6:
        std::__ostream_insert<char,std::char_traits<char>>(str,"[",1);
        poVar3 = (ostream *)std::ostream::operator<<(str,pVVar6->index);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,"]",1);
      }
      else if (TVar1 == STRUCT_MEMBER) {
        lVar2 = *(long *)((pSVar7->m_typeName)._M_string_length + 0x20);
        lVar5 = (long)pVVar6->index * 0x38;
        std::__ostream_insert<char,std::char_traits<char>>(str,".",1);
        __s = *(char **)(lVar2 + lVar5);
        if (__s == (char *)0x0) {
          std::ios::clear((int)str + (int)*(undefined8 *)(*(long *)str + -0x18));
        }
        else {
          sVar4 = strlen(__s);
          std::__ostream_insert<char,std::char_traits<char>>(str,__s,sVar4);
        }
        pSVar7 = (StructType *)(lVar2 + lVar5 + 0x20);
      }
      else if (TVar1 == ARRAY_ELEMENT) {
        pSVar7 = ((Data *)&(pSVar7->m_typeName)._M_string_length)->structPtr;
        goto LAB_0084aec6;
      }
      pVVar6 = pVVar6 + 1;
    } while (pVVar6 != (format->path->
                       super__Vector_base<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_>
                       )._M_impl.super__Vector_impl_data._M_finish);
  }
  return str;
}

Assistant:

std::ostream& operator<< (std::ostream& str, const TypeAccessFormat& format)
{
	const VarType* curType = &format.type;

	for (TypeComponentVector::const_iterator iter = format.path.begin(); iter != format.path.end(); iter++)
	{
		switch (iter->type)
		{
			case VarTypeComponent::ARRAY_ELEMENT:
				curType = &curType->getElementType(); // Update current type.
				// Fall-through.

			case VarTypeComponent::MATRIX_COLUMN:
			case VarTypeComponent::VECTOR_COMPONENT:
				str << "[" << iter->index << "]";
				break;

			case VarTypeComponent::STRUCT_MEMBER:
			{
				const StructMember& member = curType->getStructPtr()->getMember(iter->index);
				str << "." << member.getName();
				curType = &member.getType();
				break;
			}

			default:
				DE_ASSERT(false);
		}
	}

	return str;
}